

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_man.cpp
# Opt level: O3

void __thiscall FScanner::FScanner(FScanner *this,FScanner *other)

{
  (this->Name).Index = 0;
  (this->ScriptName).Chars = FString::NullString.Nothing;
  (this->ScriptBuffer).Chars = FString::NullString.Nothing;
  (this->BigStringBuffer).Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 3;
  this->ScriptOpen = false;
  operator=(this,other);
  return;
}

Assistant:

FScanner::FScanner()
{
	ScriptOpen = false;
}